

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOT<double>>::CreateAssemble
          (TPZFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOT<double>> *this)

{
  TPZAutoPointer<TPZGuiInterface> *in_RDX;
  TPZBaseMatrix *in_RSI;
  
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOT<double>_>::CreateAssemble
            ((TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOT<double>_> *)
             (this + *(long *)(*(long *)this + -0x88)),in_RSI,in_RDX);
  return;
}

Assistant:

TPZMatrix<TVar> * TPZFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZBaseMatrix &rhs, TPZAutoPointer<TPZGuiInterface> guiInterface){
	TPar::InitCreateAssemble();
    int64_t neq = this->fEquationFilter.NActiveEquations();
	TPZManVector <int> numelconnected(neq,0);
	TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront>(neq);//(this->fMesh->NEquations());
	
//	TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront> *mat = new TPZFrontMatrix<TVar,TPZFileEqnStorage<TVar>, TFront>(neq);
    mat->GetFront().SetDecomposeType(fDecomposeType);
	// if the frontal matrix is applied to a submesh, we assume there may be rigid body modes
	TPZSubCompMesh *subcmesh = dynamic_cast<TPZSubCompMesh *> (this->fMesh);	
	if (subcmesh) {
		int nrigid = subcmesh->NumberRigidBodyModes();
		if (nrigid > 0) {
			mat->GetFront().SetNumRigidBodyModes(nrigid);
			
		}
	}
	
	GetNumElConnected(numelconnected);
	mat->SetNumElConnected(numelconnected);
	
	OrderElement();
	
	Assemble(*mat,rhs,guiInterface);
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        mat->FinishWriting();
        mat->ReOpen();
//		mat->Print("Frontal matrix", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
	mat->FinishWriting();
	mat->ReOpen();
	return mat;
}